

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::DefaultExpression::Copy(DefaultExpression *this)

{
  ParsedExpression *this_00;
  ParsedExpression *in_RSI;
  _Head_base<0UL,_duckdb::DefaultExpression_*,_false> local_20;
  
  make_uniq<duckdb::DefaultExpression>();
  this_00 = &unique_ptr<duckdb::DefaultExpression,_std::default_delete<duckdb::DefaultExpression>,_true>
             ::operator->((unique_ptr<duckdb::DefaultExpression,_std::default_delete<duckdb::DefaultExpression>,_true>
                           *)&local_20)->super_ParsedExpression;
  ParsedExpression::CopyProperties(this_00,in_RSI);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> DefaultExpression::Copy() const {
	auto copy = make_uniq<DefaultExpression>();
	copy->CopyProperties(*this);
	return std::move(copy);
}